

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O0

void __thiscall leveldb::Benchmark::FinishedSingleOp(Benchmark *this)

{
  int iVar1;
  Env *pEVar2;
  undefined4 extraout_var;
  double dVar3;
  double value;
  undefined1 auVar4 [16];
  double micros;
  double now;
  Benchmark *this_local;
  
  if (FLAGS_histogram) {
    pEVar2 = Env::Default();
    iVar1 = (*pEVar2->_vptr_Env[0x15])();
    auVar4._4_4_ = extraout_var;
    auVar4._0_4_ = iVar1;
    auVar4._8_4_ = extraout_var;
    auVar4._12_4_ = 0x45300000;
    dVar3 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 1e-06;
    value = (dVar3 - this->last_op_finish_) * 1000000.0;
    Histogram::Add(&this->hist_,value);
    if (20000.0 < value) {
      fprintf(_stderr,"long op: %.1f micros%30s\r",value,"");
      fflush(_stderr);
    }
    this->last_op_finish_ = dVar3;
  }
  this->done_ = this->done_ + 1;
  if (this->next_report_ <= this->done_) {
    if (this->next_report_ < 1000) {
      this->next_report_ = this->next_report_ + 100;
    }
    else if (this->next_report_ < 5000) {
      this->next_report_ = this->next_report_ + 500;
    }
    else if (this->next_report_ < 10000) {
      this->next_report_ = this->next_report_ + 1000;
    }
    else if (this->next_report_ < 50000) {
      this->next_report_ = this->next_report_ + 5000;
    }
    else if (this->next_report_ < 100000) {
      this->next_report_ = this->next_report_ + 10000;
    }
    else if (this->next_report_ < 500000) {
      this->next_report_ = this->next_report_ + 50000;
    }
    else {
      this->next_report_ = this->next_report_ + 100000;
    }
    fprintf(_stderr,"... finished %d ops%30s\r",(ulong)(uint)this->done_,"");
    fflush(_stderr);
  }
  return;
}

Assistant:

void FinishedSingleOp() {
    if (FLAGS_histogram) {
      double now = Env::Default()->NowMicros() * 1e-6;
      double micros = (now - last_op_finish_) * 1e6;
      hist_.Add(micros);
      if (micros > 20000) {
        std::fprintf(stderr, "long op: %.1f micros%30s\r", micros, "");
        std::fflush(stderr);
      }
      last_op_finish_ = now;
    }

    done_++;
    if (done_ >= next_report_) {
      if (next_report_ < 1000)
        next_report_ += 100;
      else if (next_report_ < 5000)
        next_report_ += 500;
      else if (next_report_ < 10000)
        next_report_ += 1000;
      else if (next_report_ < 50000)
        next_report_ += 5000;
      else if (next_report_ < 100000)
        next_report_ += 10000;
      else if (next_report_ < 500000)
        next_report_ += 50000;
      else
        next_report_ += 100000;
      std::fprintf(stderr, "... finished %d ops%30s\r", done_, "");
      std::fflush(stderr);
    }
  }